

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O2

void __thiscall Pl_Base64::encode(Pl_Base64 *this,uchar *data,size_t len)

{
  uchar uVar1;
  size_t sVar2;
  size_t sVar3;
  
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = data[sVar3];
    sVar2 = this->pos;
    this->pos = sVar2 + 1;
    this->buf[sVar2] = uVar1;
    if (this->pos == 3) {
      flush(this);
    }
  }
  return;
}

Assistant:

void
Pl_Base64::encode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        this->buf[this->pos++] = *p;
        if (this->pos == 3) {
            flush();
        }
        ++p;
        --len;
    }
}